

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O0

bool __thiscall
ON_Curve::GetNextDiscontinuity
          (ON_Curve *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  ON_3dVector Km;
  ON_3dVector Kp;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  double *pdVar7;
  double dVar8;
  byte local_209;
  undefined1 local_188 [8];
  ON_3dVector Kb;
  ON_3dVector Ka;
  ON_3dVector Tb;
  ON_3dVector Ta;
  ON_3dVector local_110;
  undefined1 local_f8 [8];
  ON_3dVector D2b;
  ON_3dVector D2a;
  ON_3dVector D1b;
  ON_3dVector D1a;
  ON_3dPoint Pb;
  ON_3dPoint Pa;
  ON_Interval domain;
  bool bTestK;
  bool bTestT;
  bool bTestD2;
  bool bTestD1;
  bool bTestC0;
  bool rc;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  int *dtype_local;
  int *hint_local;
  double *t_local;
  double t1_local;
  double t0_local;
  continuity c_local;
  ON_Curve *this_local;
  
  domain.m_t[1]._7_1_ = false;
  if (dtype != (int *)0x0) {
    *dtype = 0;
  }
  if ((t0 != t1) || (NAN(t0) || NAN(t1))) {
    bVar5 = false;
    bVar3 = false;
    bVar1 = false;
    bVar4 = false;
    bVar2 = false;
    switch(c) {
    case C0_locus_continuous:
      bVar5 = true;
      break;
    case C1_locus_continuous:
      bVar5 = true;
      bVar3 = true;
      break;
    case C2_locus_continuous:
      bVar5 = true;
      bVar3 = true;
      bVar1 = true;
      break;
    case G1_locus_continuous:
      bVar5 = true;
      bVar4 = true;
      break;
    case G2_locus_continuous:
      bVar5 = true;
      bVar4 = true;
      bVar2 = true;
    }
    if (bVar5) {
      (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
      pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,1);
      if ((*pdVar7 <= t0) ||
         (pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,1), t1 < *pdVar7)) {
        pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,0);
        t_local = (double *)t1;
        if ((*pdVar7 <= t0 && t0 != *pdVar7) &&
           (pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,0), t1 <= *pdVar7)) {
          pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,0);
          t_local = (double *)*pdVar7;
        }
      }
      else {
        pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,1);
        t_local = (double *)*pdVar7;
      }
      pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,1);
      if (((t0 < *pdVar7) &&
          (pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,1), *pdVar7 <= (double)t_local)) ||
         ((pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,0), *pdVar7 <= t0 && t0 != *pdVar7
          && (pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,0), (double)t_local <= *pdVar7))
         )) {
        uVar6 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
        if ((uVar6 & 1) == 0) {
          if (dtype != (int *)0x0) {
            *dtype = 0;
          }
          *t = (double)t_local;
          domain.m_t[1]._7_1_ = true;
        }
        else if ((bVar3) || (bVar4)) {
          pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,0);
          bVar5 = Ev2Der(this,*pdVar7,(ON_3dPoint *)&Pb.z,(ON_3dVector *)&D1b.z,
                         (ON_3dVector *)&D2b.z,1,(int *)0x0);
          if (bVar5) {
            pdVar7 = ON_Interval::operator[]((ON_Interval *)&Pa.z,1);
            bVar5 = Ev2Der(this,*pdVar7,(ON_3dPoint *)&D1a.z,(ON_3dVector *)&D2a.z,
                           (ON_3dVector *)local_f8,-1,(int *)0x0);
            if (bVar5) {
              D1a.z = Pb.z;
              Pb.x = Pa.x;
              Pb.y = Pa.y;
              if (bVar3) {
                ON_3dVector::operator-(&local_110,(ON_3dVector *)&D1b.z,(ON_3dVector *)&D2a.z);
                dVar8 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&D2a.z);
                bVar5 = ON_3dVector::IsTiny(&local_110,dVar8 * 1.490116119385e-08);
                if (((bVar5 ^ 0xffU) & 1) == 0) {
                  local_209 = 0;
                  if (bVar1) {
                    ON_3dVector::operator-
                              ((ON_3dVector *)&Ta.z,(ON_3dVector *)&D2b.z,(ON_3dVector *)local_f8);
                    dVar8 = ON_3dVector::MaximumCoordinate((ON_3dVector *)local_f8);
                    bVar5 = ON_3dVector::IsTiny((ON_3dVector *)&Ta.z,dVar8 * 1.490116119385e-08);
                    local_209 = bVar5 ^ 0xff;
                  }
                  if ((local_209 & 1) != 0) {
                    if (dtype != (int *)0x0) {
                      *dtype = 2;
                    }
                    *t = (double)t_local;
                    domain.m_t[1]._7_1_ = true;
                  }
                }
                else {
                  if (dtype != (int *)0x0) {
                    *dtype = 1;
                  }
                  *t = (double)t_local;
                  domain.m_t[1]._7_1_ = true;
                }
              }
              else if (bVar4) {
                ON_EvCurvature((ON_3dVector *)&D1b.z,(ON_3dVector *)&D2b.z,(ON_3dVector *)&Tb.z,
                               (ON_3dVector *)&Kb.z);
                ON_EvCurvature((ON_3dVector *)&D2a.z,(ON_3dVector *)local_f8,(ON_3dVector *)&Ka.z,
                               (ON_3dVector *)local_188);
                dVar8 = ON_3dVector::operator*((ON_3dVector *)&Tb.z,(ON_3dVector *)&Ka.z);
                if (cos_angle_tolerance <= dVar8) {
                  if ((bVar2) &&
                     (Km.y = Ka.x, Km.x = Kb.z, Km.z = Ka.y, Kp.y = Kb.x, Kp.x = (double)local_188,
                     Kp.z = Kb.y,
                     bVar5 = ON_IsG2CurvatureContinuous
                                       (Km,Kp,cos_angle_tolerance,curvature_tolerance), !bVar5)) {
                    if (dtype != (int *)0x0) {
                      *dtype = 2;
                    }
                    *t = (double)t_local;
                    domain.m_t[1]._7_1_ = true;
                  }
                }
                else {
                  if (dtype != (int *)0x0) {
                    *dtype = 1;
                  }
                  *t = (double)t_local;
                  domain.m_t[1]._7_1_ = true;
                }
              }
            }
          }
        }
      }
    }
  }
  return domain.m_t[1]._7_1_;
}

Assistant:

bool ON_Curve::GetNextDiscontinuity( 
                ON::continuity c,
                double t0,
                double t1,
                double* t,
                int* hint,
                int* dtype,
                double cos_angle_tolerance,
                double curvature_tolerance
                ) const
{
  // this function must be overridden by curve objects that
  // can have parametric discontinuities on the interior of the curve.

  bool rc = false;

  if ( dtype )
    *dtype = 0;
  
  if ( t0 != t1 )
  {
    bool bTestC0 = false;
    bool bTestD1 = false;
    bool bTestD2 = false;
    bool bTestT = false;
    bool bTestK = false;
    switch(c)
    {
    case ON::continuity::C0_locus_continuous:
      bTestC0 = true;
      break;
    case ON::continuity::C1_locus_continuous:
      bTestC0 = true;
      bTestD1 = true;
      break;
    case ON::continuity::C2_locus_continuous:
      bTestC0 = true;
      bTestD1 = true;
      bTestD2 = true;
      break;
    case ON::continuity::G1_locus_continuous:
      bTestC0 = true;
      bTestT  = true;
      break;
    case ON::continuity::G2_locus_continuous:
      bTestC0 = true;
      bTestT  = true;
      bTestK  = true;
      break;
    default:
      // other values ignored on purpose.
      break;
    }

    if ( bTestC0 )
    {
      // 20 March 2003 Dale Lear:
      //   Have to look for locus discontinuities at ends.
      //   Must test both ends because t0 > t1 is valid input.
      //   In particular, for ON_CurveProxy::GetNextDiscontinuity() 
      //   to work correctly on reversed "real" curves, the 
      //   t0 > t1 must work right.
      ON_Interval domain = Domain();

      if ( t0 < domain[1] && t1 >= domain[1] )
        t1 = domain[1];
      else if ( t0 > domain[0] && t1 <= domain[0] )
        t1 = domain[0];

      if ( (t0 < domain[1] && t1 >= domain[1]) || (t0 > domain[0] && t1 <= domain[0]) )
      {
        if ( IsClosed() )
        {
          if ( bTestD1 || bTestT )
          {
            // need to check locus continuity at start/end of closed curve.
            ON_3dPoint Pa, Pb;
            ON_3dVector D1a, D1b, D2a, D2b;
            if (    Ev2Der(domain[0],Pa,D1a,D2a,1,nullptr) 
                 && Ev2Der(domain[1],Pb,D1b,D2b,-1,nullptr) )
            {
              Pb = Pa; // IsClosed() = true means assume Pa=Pb;
              if ( bTestD1 )
              {
                if ( !(D1a-D1b).IsTiny(D1b.MaximumCoordinate()*ON_SQRT_EPSILON ) )
                {
                  if ( dtype )
                    *dtype = 1;
                  *t = t1;
                  rc = true;
                }
                else if ( bTestD2 && !(D2a-D2b).IsTiny(D2b.MaximumCoordinate()*ON_SQRT_EPSILON) )
                {
                  if ( dtype )
                    *dtype = 2;
                  *t = t1;
                  rc = true;
                }

              }
              else if ( bTestT )
              {
                ON_3dVector Ta, Tb, Ka, Kb;
                ON_EvCurvature( D1a, D2a, Ta, Ka );
                ON_EvCurvature( D1b, D2b, Tb, Kb );
                if ( Ta*Tb < cos_angle_tolerance )
                {
                  if ( dtype )
                    *dtype = 1;
                  *t = t1;
                  rc = true;
                }
                else if ( bTestK )
                {
                  // NOTE: 
                  //  This test must exactly match the one
                  //  used in ON_NurbsCurve::GetNextDiscontinuity()
                  if ( !ON_IsG2CurvatureContinuous( Ka, Kb,
                                                    cos_angle_tolerance,
                                                    curvature_tolerance
                                                    )
                     )
                  {
                    if ( dtype )
                      *dtype = 2;
                    *t = t1;
                    rc = true;
                  }
                }
              }
            }
          }
        }
        else
        {
          // open curves are not locus continuous at ends.
          if (dtype )
            *dtype = 0; // locus C0 discontinuity
          *t = t1;
          rc = true;
        }
      }
    }
  }

  return rc;
}